

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliqueFinder.h
# Opt level: O2

void __thiscall
CLEVER::CLEVER(CLEVER *this,EdgeCalculator *edge_calculator,CliqueCollector *clique_collector,
              LogWriter *lw)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_CliqueFinder).edge_calculator = edge_calculator;
  (this->super_CliqueFinder).clique_collector = clique_collector;
  (this->super_CliqueFinder).initialized = false;
  (this->super_CliqueFinder).converged = false;
  (this->super_CliqueFinder).next_id = 0;
  (this->super_CliqueFinder).alignment_count = 0;
  (this->super_CliqueFinder).second_edge_calculator = (EdgeCalculator *)0x0;
  (this->super_CliqueFinder)._vptr_CliqueFinder = (_func_int **)&PTR__CLEVER_001d6d10;
  this->lw = lw;
  p_Var1 = &(this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header;
  (this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->capacity = 0x40;
  this->alignments = (AlignmentRecord **)0x0;
  return;
}

Assistant:

CliqueFinder(const EdgeCalculator& edge_calculator, CliqueCollector& clique_collector) : edge_calculator(edge_calculator), clique_collector(clique_collector) {
    	alignment_count = 0;
    	second_edge_calculator = nullptr;
        next_id = 0;
        initialized = false;
        converged = false;        
    }